

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

int32 vector_maxcomp_float32(float32 *val,int32 len)

{
  int local_1c;
  int local_18;
  int32 bi;
  int32 i;
  int32 len_local;
  float32 *val_local;
  
  local_1c = 0;
  for (local_18 = 1; local_18 < len; local_18 = local_18 + 1) {
    if ((float)val[local_1c] <= (float)val[local_18] && (float)val[local_18] != (float)val[local_1c]
       ) {
      local_1c = local_18;
    }
  }
  return local_1c;
}

Assistant:

int32
vector_maxcomp_float32(float32 * val, int32 len)
{
    int32 i, bi;

    bi = 0;
    for (i = 1; i < len; i++) {
        if (val[i] > val[bi])
            bi = i;
    }
    return bi;
}